

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::semantic_rule<jsonip::grammar::true_p,jsonip::grammar::true_t>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  iterator __position;
  Reader *pRVar2;
  PositionType pcVar3;
  size_t sVar4;
  semantic_state *this;
  helper *phVar5;
  bool bVar6;
  PositionType p;
  char *pcVar7;
  pointer ppVar8;
  PositionType p_1;
  char *pcVar9;
  pointer *pppVar10;
  State local_28;
  
  local_28.pos_ = state->reader_->pos_;
  local_28.line_ = state->line_;
  pppVar10 = (pointer *)
             &(state->stack_).
              super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  __position._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,__position,&local_28);
  }
  else {
    (__position._M_current)->pos_ = local_28.pos_;
    (__position._M_current)->line_ = local_28.line_;
    *pppVar10 = (pointer)((pointer)*pppVar10 + 1);
  }
  pRVar2 = state->reader_;
  pcVar3 = pRVar2->buf_;
  pcVar7 = pRVar2->pos_;
  sVar4 = pRVar2->len_;
  pcVar9 = pcVar7;
  if (((long)pcVar7 - (long)pcVar3 != sVar4) && (*pcVar7 == 't')) {
    pcVar9 = pcVar7 + 1;
    pRVar2->pos_ = pcVar9;
    if (((long)pcVar9 - (long)pcVar3 != sVar4) && (*pcVar9 == 'r')) {
      pcVar9 = pcVar7 + 2;
      pRVar2->pos_ = pcVar9;
      if (((long)pcVar9 - (long)pcVar3 != sVar4) && (*pcVar9 == 'u')) {
        pcVar9 = pcVar7 + 3;
        pRVar2->pos_ = pcVar9;
        if (((long)pcVar9 - (long)pcVar3 != sVar4) && (*pcVar9 == 'e')) {
          pcVar7 = pcVar7 + 4;
          pRVar2->pos_ = pcVar7;
          if (state->max_pos_ < pcVar7) {
            state->max_pos_ = pcVar7;
          }
          ppSVar1 = &(state->stack_).
                     super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
          this = state->ss_;
          semantic_state::pre(this);
          pppVar10 = &(this->state).
                      super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          ppVar8 = (this->state).
                   super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          phVar5 = ppVar8[-1].second;
          (*phVar5->_vptr_helper[4])(phVar5,ppVar8 + -1,1);
          ppVar8 = (this->state).
                   super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar6 = true;
          goto LAB_00109ac7;
        }
      }
    }
  }
  if (state->max_pos_ < pcVar9) {
    state->max_pos_ = pcVar9;
  }
  pRVar2->pos_ = (state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
  ppVar8 = (pointer)(state->stack_).
                    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  state->line_ = (size_t)ppVar8[-1].second;
  bVar6 = false;
LAB_00109ac7:
  *pppVar10 = ppVar8 + -1;
  return bVar6;
}

Assistant:

static inline bool match(S& state)
        {
            typename S::PositionType p = state.pos();

            // Try the rule itself
            bool result;
            if (true == (result = C0::match(state)))
                A::process_match(state, std::make_pair(p, state.pos() - p));

            return result;
        }